

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::ConstantEqual::operator()(ConstantEqual *this,Constant *c1,Constant *c2)

{
  void *__s1;
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t __n;
  long *plVar2;
  undefined4 extraout_var_00;
  
  if (c1->type_ == c2->type_) {
    iVar1 = (*c1->_vptr_Constant[0xd])(c1);
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar2 == (long *)0x0) {
      iVar1 = (*c1->_vptr_Constant[0x11])(c1);
      plVar2 = (long *)CONCAT44(extraout_var_01,iVar1);
      if (plVar2 == (long *)0x0) {
        iVar1 = (*c1->_vptr_Constant[0x16])(c1);
        if (CONCAT44(extraout_var_03,iVar1) != 0) {
          iVar1 = (*c2->_vptr_Constant[0x16])(c2);
          return CONCAT44(extraout_var_04,iVar1) != 0;
        }
        __assert_fail("false && \"Tried to compare two invalid Constant instances.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                      ,0x1ef,
                      "bool spvtools::opt::analysis::ConstantEqual::operator()(const Constant *, const Constant *) const"
                     );
      }
      iVar1 = (*c2->_vptr_Constant[0x11])(c2);
      plVar3 = (long *)CONCAT44(extraout_var_02,iVar1);
    }
    else {
      iVar1 = (*c2->_vptr_Constant[0xd])(c2);
      plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
    }
    if (plVar3 != (long *)0x0) {
      puVar4 = (undefined8 *)(**(code **)(*plVar2 + 0xc0))(plVar2);
      puVar5 = (undefined8 *)(**(code **)(*plVar3 + 0xc0))(plVar3);
      __s1 = (void *)*puVar4;
      __n = (long)puVar4[1] - (long)__s1;
      if (__n == puVar5[1] - (long)*puVar5) {
        if ((void *)puVar4[1] != __s1) {
          iVar1 = bcmp(__s1,(void *)*puVar5,__n);
          return iVar1 == 0;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

const Type* type() const { return type_; }